

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

xmlParserStatus xmlCtxtGetStatus(xmlParserCtxt *ctxt)

{
  int iVar1;
  xmlParserStatus xVar2;
  xmlParserStatus xVar3;
  bool bVar4;
  
  if (ctxt == (xmlParserCtxt *)0x0) {
    return XML_STATUS_CATASTROPHIC_ERROR|XML_STATUS_NOT_NS_WELL_FORMED|XML_STATUS_NOT_WELL_FORMED;
  }
  iVar1 = xmlIsCatastrophicError((ctxt->lastError).level,(ctxt->lastError).code);
  if (iVar1 == 0) {
    bVar4 = ctxt->wellFormed == 0;
    xVar2 = bVar4 + XML_STATUS_NOT_NS_WELL_FORMED;
    if (ctxt->nsWellFormed != 0) {
      xVar2 = (uint)bVar4;
    }
    xVar3 = xVar2;
    if ((ctxt->validate != 0) &&
       (xVar3 = xVar2 + XML_STATUS_DTD_VALIDATION_FAILED, ctxt->valid != 0)) {
      xVar3 = xVar2;
    }
  }
  else {
    xVar3 = (uint)(ctxt->validate != 0) * 4 +
            (XML_STATUS_CATASTROPHIC_ERROR|XML_STATUS_NOT_NS_WELL_FORMED|XML_STATUS_NOT_WELL_FORMED)
    ;
  }
  return xVar3;
}

Assistant:

xmlParserStatus
xmlCtxtGetStatus(xmlParserCtxt *ctxt) {
    xmlParserStatus bits = 0;

    if (xmlCtxtIsCatastrophicError(ctxt)) {
        bits |= XML_STATUS_CATASTROPHIC_ERROR |
                XML_STATUS_NOT_WELL_FORMED |
                XML_STATUS_NOT_NS_WELL_FORMED;
        if ((ctxt != NULL) && (ctxt->validate))
            bits |= XML_STATUS_DTD_VALIDATION_FAILED;

        return(bits);
    }

    if (!ctxt->wellFormed)
        bits |= XML_STATUS_NOT_WELL_FORMED;
    if (!ctxt->nsWellFormed)
        bits |= XML_STATUS_NOT_NS_WELL_FORMED;
    if ((ctxt->validate) && (!ctxt->valid))
        bits |= XML_STATUS_DTD_VALIDATION_FAILED;

    return(bits);
}